

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

MemberNameAndValue * __thiscall
choc::value::ValueView::getObjectMemberAt
          (MemberNameAndValue *__return_storage_ptr__,ValueView *this,uint32_t index)

{
  uint8_t *puVar1;
  StringDictionary *pSVar2;
  MemberNameAndType *pMVar3;
  ElementTypeAndOffset info;
  ElementTypeAndOffset local_50;
  
  pMVar3 = Type::getObjectMember(&this->type,index);
  Type::getElementTypeAndOffset(&local_50,&this->type,index);
  __return_storage_ptr__->name = (pMVar3->name)._M_str;
  puVar1 = this->data;
  pSVar2 = this->stringDictionary;
  (__return_storage_ptr__->value).type.mainType = local_50.elementType.mainType;
  (__return_storage_ptr__->value).type.content.object = local_50.elementType.content.object;
  *(undefined8 *)((long)&(__return_storage_ptr__->value).type.content + 8) =
       local_50.elementType.content._8_8_;
  (__return_storage_ptr__->value).type.allocator = local_50.elementType.allocator;
  local_50.elementType.mainType = void_;
  (__return_storage_ptr__->value).data = puVar1 + local_50.offset;
  (__return_storage_ptr__->value).stringDictionary = pSVar2;
  Type::deleteAllocatedObjects(&local_50.elementType);
  return __return_storage_ptr__;
}

Assistant:

inline MemberNameAndValue ValueView::getObjectMemberAt (uint32_t index) const
{
    auto& member = type.getObjectMember (index);
    auto info = type.getElementTypeAndOffset (index);
    return { member.name.data(), ValueView (std::move (info.elementType), data + info.offset, stringDictionary) };
}